

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O2

bool __thiscall webfront::http::Request::completeRequest(Request *this,char input)

{
  State next;
  Method MVar1;
  int iVar2;
  BadRequestException *this_00;
  string *this_01;
  bool bVar3;
  string_view text;
  anon_class_1_0_00000001 local_61;
  anon_class_8_1_8991fb9c setState;
  Header local_58;
  
  setState.this = this;
  if ((completeRequest(char)::buffer_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&completeRequest(char)::buffer_abi_cxx11_), iVar2 != 0)) {
    completeRequest(char)::buffer_abi_cxx11_._M_dataplus._M_p =
         (pointer)&completeRequest(char)::buffer_abi_cxx11_.field_2;
    completeRequest(char)::buffer_abi_cxx11_._M_string_length = 0;
    completeRequest(char)::buffer_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(::std::__cxx11::string::~string,&completeRequest(char)::buffer_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&completeRequest(char)::buffer_abi_cxx11_);
  }
  bVar3 = true;
  switch(this->state) {
  case methodStart:
    bVar3 = true;
    if ((-1 < input) && (input != '\x7f' && 0x1f < (byte)input)) {
      bVar3 = completeRequest::anon_class_1_0_00000001::operator()(&local_61,input);
    }
    completeRequest::anon_class_8_1_8991fb9c::operator()(&setState,bVar3,method);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&completeRequest(char)::buffer_abi_cxx11_,input);
    break;
  case method:
    if (input != ' ') {
      if (((input < '\0') || ((byte)input < 0x20)) ||
         ((input == '\x7f' ||
          (bVar3 = completeRequest::anon_class_1_0_00000001::operator()(&local_61,input), bVar3))))
      {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_0011119a;
      }
      this_01 = &completeRequest(char)::buffer_abi_cxx11_;
      goto LAB_00110fc6;
    }
    this->state = URI;
    text._M_str = (char *)&switchD_00110c3c::switchdataD_0011b08c;
    text._M_len = (size_t)completeRequest(char)::buffer_abi_cxx11_._M_dataplus._M_p;
    MVar1 = getMethodFromString((Request *)completeRequest(char)::buffer_abi_cxx11_._M_string_length
                                ,text);
    this->method = MVar1;
    break;
  case URI:
    if (input != ' ') {
      if (((byte)input < 0x20) || (input == '\x7f')) {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_0011119a;
      }
      this_01 = &this->uri;
      goto LAB_00110fc6;
    }
    this->state = versionH;
    break;
  case versionH:
    bVar3 = input != 'H';
    next = versionT1;
    goto LAB_00110e79;
  case versionT1:
    bVar3 = input != 'T';
    next = versionT2;
    goto LAB_00110e79;
  case versionT2:
    bVar3 = input != 'T';
    next = versionP;
    goto LAB_00110e79;
  case versionP:
    bVar3 = input != 'P';
    next = versionSlash;
    goto LAB_00110e79;
  case versionSlash:
    completeRequest::anon_class_8_1_8991fb9c::operator()(&setState,input != '/',versionMajorStart);
    this->httpVersionMajor = 0;
    this->httpVersionMinor = 0;
    break;
  case versionMajorStart:
    completeRequest::anon_class_8_1_8991fb9c::operator()
              (&setState,(byte)(input - 0x3aU) < 0xf6,versionMajor);
    this->httpVersionMajor = this->httpVersionMajor * 10 + (int)input + -0x30;
    break;
  case versionMajor:
    if (input == '.') {
      this->state = versionMinorStart;
    }
    else {
      if (9 < (byte)(input - 0x30U)) {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_0011119a;
      }
      this->httpVersionMajor = (uint)(byte)(input - 0x30U) + this->httpVersionMajor * 10;
    }
    break;
  case versionMinorStart:
    completeRequest::anon_class_8_1_8991fb9c::operator()
              (&setState,(byte)(input - 0x3aU) < 0xf6,versionMinor);
    this->httpVersionMinor = this->httpVersionMinor * 10 + (int)input + -0x30;
    break;
  case versionMinor:
    if (input == '\r') {
      this->state = newline1;
    }
    else {
      if (9 < (byte)(input - 0x30U)) {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_0011119a;
      }
      this->httpVersionMinor = (uint)(byte)(input - 0x30U) + this->httpVersionMinor * 10;
    }
    break;
  case newline1:
  case newline2:
    bVar3 = input != '\n';
    next = headerLineStart;
    goto LAB_00110e79;
  case headerLineStart:
    if (input == '\r') {
      this->state = newline3;
    }
    else if (((this->super_Headers).headers.
              super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->super_Headers).headers.
              super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              ._M_impl.super__Vector_impl_data._M_finish) || ((input != ' ' && (input != '\t')))) {
      if ((input < '\0') ||
         ((((byte)input < 0x20 || (input == '\x7f')) ||
          (bVar3 = completeRequest::anon_class_1_0_00000001::operator()(&local_61,input), bVar3))))
      {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_0011119a;
      }
      local_58.name._M_dataplus._M_p = (pointer)&local_58.name.field_2;
      local_58.value._M_string_length = 0;
      local_58.value.field_2._8_8_ = 0;
      local_58.name.field_2._M_allocated_capacity = 0;
      local_58.name.field_2._8_8_ = 0;
      local_58.name._M_string_length = 0;
      local_58.value._M_dataplus._M_p = (pointer)&local_58.value.field_2;
      local_58.value.field_2._M_allocated_capacity = 0;
      std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
      ::emplace_back<webfront::http::Headers::Header>
                ((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                  *)this,&local_58);
      Headers::Header::~Header(&local_58);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&(this->super_Headers).headers.
                  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].name,input);
      this->state = headerName;
    }
    else {
      this->state = headerLws;
    }
    break;
  case headerLws:
    if (input == '\t') {
      return false;
    }
    if (input == ' ') {
      return false;
    }
    if (input != '\r') {
      if (((byte)input < 0x20) || (input == '\x7f')) {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_0011119a;
      }
      this->state = headerValue;
      this_01 = &(this->super_Headers).headers.
                 super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].value;
      goto LAB_00110fc6;
    }
LAB_00110e8e:
    this->state = newline2;
    break;
  case headerName:
    if (input != ':') {
      if ((((input < '\0') || ((byte)input < 0x20)) || (input == '\x7f')) ||
         (bVar3 = completeRequest::anon_class_1_0_00000001::operator()(&local_61,input), bVar3)) {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_0011119a;
      }
      this_01 = &(this->super_Headers).headers.
                 super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].name;
      goto LAB_00110fc6;
    }
    this->state = spaceBeforeHeaderValue;
    break;
  case spaceBeforeHeaderValue:
    bVar3 = input != ' ';
    next = headerValue;
LAB_00110e79:
    completeRequest::anon_class_8_1_8991fb9c::operator()(&setState,bVar3,next);
    break;
  case headerValue:
    if (input == '\r') goto LAB_00110e8e;
    if (((byte)input < 0x20) || (input == '\x7f')) {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_0011119a;
    }
    this_01 = &(this->super_Headers).headers.
               super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].value;
LAB_00110fc6:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (this_01,input);
    break;
  case newline3:
    if (input == '\n') {
      this->state = completed;
      return true;
    }
    this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
    BadRequestException::BadRequestException(this_00);
    goto LAB_0011119a;
  case completed:
    goto switchD_00110c3c_caseD_14;
  default:
    this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
    BadRequestException::BadRequestException(this_00);
LAB_0011119a:
    __cxa_throw(this_00,&BadRequestException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar3 = false;
switchD_00110c3c_caseD_14:
  return bVar3;
}

Assistant:

bool completeRequest(char input) {
        auto isChar = [](char c) { return c >= 0; };
        auto isCtrl = [](char c) { return (c >= 0 && c <= 31) || (c == 127); };
        auto isSpecial = [](char c) {   switch (c) {
            case '(': case ')': case '<': case '>': case '@': case ',': case ';': case ':': case '\\': case '"':
            case '/': case '[': case ']': case '?': case '=': case '{': case '}': case ' ': case '\t': return true;
            default: return false;
        }};
        auto isDigit = [](char c) { return c >= '0' && c <= '9'; };
        auto setState = [this](bool cond, State next) {
            state = next;
            if (cond) throw BadRequestException();
        };

        static std::string buffer;
        using enum State;
        switch (state) {
            case methodStart:
                setState(!isChar(input) || isCtrl(input) || isSpecial(input), method);
                buffer = input;
                break;
            case method: if (input == ' ') { state = URI; setMethod(buffer); }
                              else if (!isChar(input) || isCtrl(input) || isSpecial(input)) { throw BadRequestException(); }
                              else buffer.push_back(input);
                break;
            case URI: if (input == ' ') { state = versionH; break; }
                           else if (isCtrl(input)) throw BadRequestException();
                           else { uri.push_back(input); break; }
            case versionH: setState(input != 'H', versionT1); break;
            case versionT1: setState(input != 'T', versionT2); break;
            case versionT2: setState(input != 'T', versionP); break;
            case versionP: setState(input != 'P', versionSlash); break;
            case versionSlash: setState(input != '/', versionMajorStart); httpVersionMajor = 0; httpVersionMinor = 0; break;
            case versionMajorStart: setState(!isDigit(input), versionMajor); httpVersionMajor = httpVersionMajor * 10 + input - '0'; break;
            case versionMajor: if (input == '.') state = versionMinorStart;
                                    else if (isDigit(input)) httpVersionMajor = httpVersionMajor * 10 + input - '0';
                                    else throw BadRequestException();
                break;
            case versionMinorStart: setState(!isDigit(input), versionMinor); httpVersionMinor = httpVersionMinor * 10 + input - '0'; break;
            case versionMinor: if (input == '\r') state = newline1;
                                    else if (isDigit(input)) httpVersionMinor = httpVersionMinor * 10 + input - '0';
                                    else throw BadRequestException();
                break;
            case newline1: setState(input != '\n', headerLineStart); break;
            case headerLineStart: if (input == '\r') { state = newline3; break; }
                                       else if (!headers.empty() && (input == ' ' || input == '\t')) { state = headerLws; break; }
                                       else if (!isChar(input) || isCtrl(input) || isSpecial(input)) throw BadRequestException();
                                       else { headers.push_back({}); headers.back().name.push_back(input); state = headerName; break; }
            case headerLws:if (input == '\r') { state = newline2; break; }
                                 else if (input == ' ' || input == '\t') break;
                                 else if (isCtrl(input)) throw BadRequestException();
                                 else { state = headerValue; headers.back().value.push_back(input); break; }
            case headerName: if (input == ':') { state = spaceBeforeHeaderValue; break; }
                                  else if (!isChar(input) || isCtrl(input) || isSpecial(input)) throw BadRequestException();
                                  else { headers.back().name.push_back(input); break; }
            case spaceBeforeHeaderValue: setState(input != ' ', headerValue); break;
            case headerValue: if (input == '\r') { state = newline2; break; }
                                   else if (isCtrl(input)) throw BadRequestException();
                                   else { headers.back().value.push_back(input); break; }
            case newline2: setState(input != '\n', headerLineStart); break;
            case newline3: if (input == '\n') { state = completed; return true; } else throw BadRequestException();
            case completed: return true;
            default: throw BadRequestException();
        }
        return false;
    }